

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

void __thiscall
helics::ValueFederateManager::removeTarget(ValueFederateManager *this,Input *inp,string_view target)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __position;
  _Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  el;
  InterfaceHandle *__k;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar2;
  handle iTHandle;
  handle local_48;
  
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::lock(&local_48,&this->inputTargets);
  __k = &(inp->super_Interface).handle;
  pVar2 = std::
          _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(&(local_48.data)->_M_t,__k);
  __position = pVar2.first._M_node;
  do {
    if (__position._M_node == pVar2.second._M_node._M_node) {
LAB_001bd45b:
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
      return;
    }
    __y._M_str = (char *)__position._M_node[1]._M_parent;
    __y._M_len = (size_t)__position._M_node[1]._M_left;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)target,__y);
    if (bVar1) {
      (*this->coreObject->_vptr_Core[0x29])
                (this->coreObject,(ulong)(uint)__k->hid,target._M_len,target._M_str);
      std::
      _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
      ::erase_abi_cxx11_((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
                          *)local_48.data,(iterator)__position._M_node);
      goto LAB_001bd45b;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

void ValueFederateManager::removeTarget(const Input& inp, std::string_view target)
{
    auto iTHandle = inputTargets.lock();
    auto rng = iTHandle->equal_range(inp.handle);
    for (auto el = rng.first; el != rng.second; ++el) {
        if (el->second == target) {
            coreObject->removeTarget(inp.handle, target);
            iTHandle->erase(el);
            break;
        }
    }
    // TODO(PT): erase from targetID's
}